

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachment
          (Impl *this,Value *value,VkAttachmentReference **out_reference)

{
  VkAttachmentReference *ref;
  VkAttachmentReference *ret;
  VkAttachmentReference **out_reference_local;
  Value *value_local;
  Impl *this_local;
  
  ref = ScratchAllocator::allocate_cleared<VkAttachmentReference>(&this->allocator);
  parse_attachment_base<VkAttachmentReference>(ref,value);
  *out_reference = ref;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_attachment(const Value &value, const VkAttachmentReference **out_reference)
{
	auto *ret = allocator.allocate_cleared<VkAttachmentReference>();
	parse_attachment_base(*ret, value);
	*out_reference = ret;
	return true;
}